

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *
__thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::
WillOnce(TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
         *this,Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
               *action)

{
  pointer *pppvVar1;
  Clause CVar2;
  uint uVar3;
  char *pcVar4;
  iterator __position;
  FailureReporterInterface *pFVar5;
  function<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *this_00;
  function<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [3];
  
  CVar2 = (this->super_ExpectationBase).last_clause_;
  local_48 = (function<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
              *)(local_40 + 1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().","");
  if (5 < (int)CVar2) {
    uVar3 = (this->super_ExpectationBase).line_;
    pcVar4 = (this->super_ExpectationBase).file_;
    pFVar5 = GetFailureReporter();
    (*pFVar5->_vptr_FailureReporterInterface[2])(pFVar5,0,pcVar4,(ulong)uVar3,&local_48);
  }
  if (local_48 !=
      (function<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *)
      (local_40 + 1)) {
    operator_delete(local_48);
  }
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  this_00 = (function<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
             *)operator_new(0x20);
  std::function<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::
  function(this_00,&action->fun_);
  __position._M_current =
       (this->super_ExpectationBase).untyped_actions_.
       super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = this_00;
  if (__position._M_current ==
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void_const*,std::allocator<void_const*>>::_M_realloc_insert<void_const*>
              ((vector<void_const*,std::allocator<void_const*>> *)
               &(this->super_ExpectationBase).untyped_actions_,__position,&local_48);
  }
  else {
    *__position._M_current = this_00;
    pppvVar1 = &(this->super_ExpectationBase).untyped_actions_.
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    Exactly((testing *)&local_48,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    (this->super_ExpectationBase).cardinality_.impl_.
    super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->super_ExpectationBase).cardinality_.impl_.
                super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_40);
    if (local_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40[0]._M_pi);
    }
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }